

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uStack_90;
  int n;
  size_t len;
  size_t numbytes;
  char *s;
  char buff [64];
  long local_30;
  size_t totalbytes;
  int nargs;
  int arg_local;
  FILE *f_local;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  local_30 = 0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  totalbytes._0_4_ = iVar1 - arg;
  totalbytes._4_4_ = arg;
  while( true ) {
    if ((int)totalbytes == 0) {
      return 1;
    }
    uVar2 = lua_numbertocstring(L,totalbytes._4_4_,(char *)&s);
    uStack_90 = (ulong)uVar2;
    if (uStack_90 == 0) {
      numbytes = (size_t)luaL_checklstring(L,totalbytes._4_4_,&stack0xffffffffffffff70);
    }
    else {
      numbytes = (size_t)&s;
      uStack_90 = uStack_90 - 1;
    }
    len = fwrite((void *)numbytes,1,uStack_90,(FILE *)f);
    local_30 = len + local_30;
    if (len < uStack_90) break;
    totalbytes._4_4_ = totalbytes._4_4_ + 1;
    totalbytes._0_4_ = (int)totalbytes + -1;
  }
  iVar1 = luaL_fileresult(L,0,(char *)0x0);
  lua_pushinteger(L,local_30);
  return iVar1 + 1;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  size_t totalbytes = 0;  /* total number of bytes written */
  errno = 0;
  for (; nargs--; arg++) {  /* for each argument */
    char buff[LUA_N2SBUFFSZ];
    const char *s;
    size_t numbytes;  /* bytes written in one call to 'fwrite' */
    size_t len = lua_numbertocstring(L, arg, buff);  /* try as a number */
    if (len > 0) {  /* did conversion work (value was a number)? */
      s = buff;
      len--;
    }
    else  /* must be a string */
      s = luaL_checklstring(L, arg, &len);
    numbytes = fwrite(s, sizeof(char), len, f);
    totalbytes += numbytes;
    if (numbytes < len) {  /* write error? */
      int n = luaL_fileresult(L, 0, NULL);
      lua_pushinteger(L, cast_st2S(totalbytes));
      return n + 1;  /* return fail, error msg., error code, and counter */
    }
  }
  return 1;  /* no errors; file handle already on stack top */
}